

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O0

void read_file_contents_proc(Am_Object *param_1,Am_Value_List *contents)

{
  byte bVar1;
  Am_Value *pAVar2;
  Am_Object local_48 [3];
  Am_Object local_30;
  Am_Object item;
  Am_Value_List current;
  Am_Value_List *contents_local;
  Am_Object *param_0_local;
  
  pAVar2 = (Am_Value *)Am_Object::Get(0x7468,0x82);
  Am_Value_List::Am_Value_List((Am_Value_List *)&item,pAVar2);
  Am_Object::Am_Object(&local_30);
  Am_Value_List::Start();
  while( true ) {
    bVar1 = Am_Value_List::Last();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    pAVar2 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&local_30,pAVar2);
    Am_Object::Remove_From_Owner();
    Am_Value_List::Next();
  }
  Am_Value_List::Start();
  while( true ) {
    bVar1 = Am_Value_List::Last();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    pAVar2 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&local_30,pAVar2);
    Am_Object::Am_Object(local_48,(Am_Object *)&local_30);
    Am_Object::Add_Part((Am_Object *)&created_objs,SUB81(local_48,0),1);
    Am_Object::~Am_Object(local_48);
    Am_Value_List::Next();
  }
  Am_Object::~Am_Object(&local_30);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&item);
  return;
}

Assistant:

Am_Define_Method (Am_Handle_Loaded_Items_Method, void, read_file_contents,
		  (Am_Object /* command */, Am_Value_List &contents)) {
  Am_Value_List current = created_objs.Get (Am_GRAPHICAL_PARTS);
  Am_Object item;
  for (current.Start (); !current.Last (); current.Next ()) {
    item = current.Get ();
    item.Remove_From_Owner ();
  }
  for (contents.Start (); !contents.Last (); contents.Next ()) {
    item = contents.Get ();
    created_objs.Add_Part (item);
  }
}